

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxShift::Resolve(FxShift *this,FCompileContext *ctx)

{
  BYTE BVar1;
  FxExpression *pFVar2;
  PString *pPVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxConstant *this_00;
  uint uVar6;
  FScriptPosition *pFVar7;
  byte bVar8;
  FString local_28;
  
  if ((this->super_FxBinary).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxBinary).super_FxExpression.isresolved = true;
  pFVar2 = (this->super_FxBinary).left;
  if (pFVar2 != (FxExpression *)0x0) {
    iVar5 = (*pFVar2->_vptr_FxExpression[2])(pFVar2,ctx);
    (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var,iVar5);
  }
  pFVar2 = (this->super_FxBinary).right;
  if (pFVar2 != (FxExpression *)0x0) {
    iVar5 = (*pFVar2->_vptr_FxExpression[2])(pFVar2,ctx);
    (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_00,iVar5);
  }
  pFVar2 = (this->super_FxBinary).left;
  this_00 = (FxConstant *)0x0;
  if ((pFVar2 != (FxExpression *)0x0) && ((this->super_FxBinary).right != (FxExpression *)0x0)) {
    iVar5 = (*(pFVar2->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
    if (((char)iVar5 == '\0') ||
       (iVar5 = (*(((this->super_FxBinary).right)->ValueType->super_PTypeBase).super_DObject.
                  _vptr_DObject[8])(), (char)iVar5 == '\0')) {
      this_00 = (FxConstant *)0x0;
      FScriptPosition::Message
                (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
                 "Incompatible operands for shift operation");
    }
    else {
      bVar4 = FxBinary::Promote(&this->super_FxBinary,ctx,true);
      if (!bVar4) {
        return (FxExpression *)0x0;
      }
      if (((this->super_FxBinary).super_FxExpression.ValueType == (PType *)TypeUInt32) &&
         ((this->super_FxBinary).Operator == 0x116)) {
        (this->super_FxBinary).Operator = 0x117;
      }
      iVar5 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
      if ((char)iVar5 == '\0') {
        return (FxExpression *)this;
      }
      iVar5 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])();
      if ((char)iVar5 == '\0') {
        return (FxExpression *)this;
      }
      pFVar2 = (this->super_FxBinary).left;
      pPVar3 = (PString *)pFVar2[1]._vptr_FxExpression;
      pFVar7 = &pFVar2[1].ScriptPosition;
      if (pPVar3 == TypeString) {
        FString::AttachToOther(&local_28,&pFVar7->FileName);
      }
      else {
        local_28.Chars = (pFVar7->FileName).Chars;
      }
      BVar1 = (pPVar3->super_PBasicType).super_PType.RegType;
      if (BVar1 == '\x01') {
        uVar6 = (uint)(double)local_28.Chars;
      }
      else {
        uVar6 = 0;
        if (BVar1 == '\0') {
          uVar6 = (uint)local_28.Chars;
        }
      }
      if (pPVar3 == TypeString) {
        FString::~FString(&local_28);
      }
      pFVar2 = (this->super_FxBinary).right;
      pPVar3 = (PString *)pFVar2[1]._vptr_FxExpression;
      pFVar7 = &pFVar2[1].ScriptPosition;
      if (pPVar3 == TypeString) {
        FString::AttachToOther(&local_28,&pFVar7->FileName);
      }
      else {
        local_28.Chars = (pFVar7->FileName).Chars;
      }
      BVar1 = (pPVar3->super_PBasicType).super_PType.RegType;
      if (BVar1 == '\x01') {
        bVar8 = (byte)(int)(double)local_28.Chars;
      }
      else {
        bVar8 = 0;
        if (BVar1 == '\0') {
          bVar8 = (byte)local_28.Chars;
        }
      }
      if (pPVar3 == TypeString) {
        FString::~FString(&local_28);
      }
      this_00 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
      iVar5 = (this->super_FxBinary).Operator;
      if (iVar5 == 0x116) {
        uVar6 = (int)uVar6 >> (bVar8 & 0x1f);
      }
      else if (iVar5 == 0x118) {
        uVar6 = uVar6 << (bVar8 & 0x1f);
      }
      else {
        uVar6 = uVar6 >> (bVar8 & 0x1f);
        if (iVar5 != 0x117) {
          uVar6 = 0;
        }
      }
      FxConstant::FxConstant
                (this_00,uVar6,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
    }
  }
  (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
  return &this_00->super_FxExpression;
}

Assistant:

FxExpression *FxShift::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return nullptr;
	}

	if (left->IsNumeric() && right->IsNumeric())
	{
		if (!Promote(ctx, true)) return nullptr;
		if (ValueType == TypeUInt32 && Operator == TK_RShift) Operator = TK_URShift;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible operands for shift operation");
		delete this;
		return nullptr;
	}

	if (left->isConstant() && right->isConstant())
	{
		int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
		int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();

		FxExpression *e = new FxConstant(
			Operator == TK_LShift ? v1 << v2 :
			Operator == TK_RShift ? v1 >> v2 :
			Operator == TK_URShift ? int((unsigned int)(v1) >> v2) : 0, ScriptPosition);

		delete this;
		return e;
	}
	return this;
}